

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueueBenchmark.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  size_t sVar4;
  undefined8 uVar5;
  __atomic_base<unsigned_long> _Var6;
  __atomic_base<unsigned_long> _Var7;
  int iVar8;
  long lVar9;
  thread t;
  thread t_1;
  int cpu1;
  SPSCQueue<int,_std::allocator<int>_> q;
  SPSCQueue<int,_std::allocator<int>_> q2;
  long *local_318;
  long local_310;
  int local_304;
  undefined1 local_300 [128];
  ulong local_280;
  __atomic_base<unsigned_long> local_240;
  size_t local_200;
  undefined1 local_1c0 [128];
  size_t local_140;
  __atomic_base<unsigned_long> local_100;
  __atomic_base<unsigned_long> local_c0;
  
  local_304 = -1;
  lVar9 = 0xffffffff;
  if (argc != 3) {
LAB_001025fa:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SPSCQueue:",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    local_300._64_8_ = 0;
    local_280 = 0;
    local_240._M_i = 0;
    local_200 = 0;
    local_300._0_8_ = 0x989681;
    local_300._8_8_ =
         __gnu_cxx::new_allocator<int>::allocate
                   ((new_allocator<int> *)local_300,0x9896a1,(void *)0x0);
    local_318 = (long *)0x0;
    local_1c0._0_8_ = operator_new(0x18);
    *(undefined ***)local_1c0._0_8_ = &PTR___State_00105cb8;
    *(int **)(local_1c0._0_8_ + 8) = &local_304;
    *(new_allocator<int> **)(local_1c0._0_8_ + 0x10) = (new_allocator<int> *)local_300;
    std::thread::_M_start_thread(&local_318,local_1c0,0);
    if (local_1c0._0_8_ != 0) {
      (**(code **)(*(long *)local_1c0._0_8_ + 8))();
    }
    iVar1 = (int)lVar9;
    pinThread(iVar1);
    iVar8 = 0;
    std::chrono::_V2::steady_clock::now();
    do {
      _Var7._M_i = local_280;
      _Var6._M_i = 0;
      if (local_300._64_8_ + 1 != local_300._0_8_) {
        _Var6._M_i = local_300._64_8_ + 1;
      }
      do {
        local_280 = _Var7._M_i;
        _Var7._M_i = local_240._M_i;
      } while (_Var6._M_i == local_280);
      *(int *)(local_300._8_8_ + (local_300._64_8_ + 0x10) * 4) = iVar8;
      iVar8 = iVar8 + 1;
      local_300._64_8_ = _Var6._M_i;
    } while (iVar8 != 10000000);
    std::thread::join();
    std::chrono::_V2::steady_clock::now();
    poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ops/ms",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (local_318 == (long *)0x0) {
      rigtorp::SPSCQueue<int,_std::allocator<int>_>::~SPSCQueue
                ((SPSCQueue<int,_std::allocator<int>_> *)local_300);
      local_300._64_8_ = 0;
      local_280 = 0;
      local_240._M_i = 0;
      local_200 = 0;
      local_300._0_8_ = 0x989681;
      local_300._8_8_ =
           __gnu_cxx::new_allocator<int>::allocate
                     ((new_allocator<int> *)local_300,0x9896a1,(void *)0x0);
      local_1c0._64_8_ = 0;
      local_140 = 0;
      local_100._M_i = 0;
      local_c0._M_i = 0;
      local_1c0._0_8_ = 0x989681;
      local_1c0._8_8_ =
           __gnu_cxx::new_allocator<int>::allocate
                     ((new_allocator<int> *)local_1c0,0x9896a1,(void *)0x0);
      local_310 = 0;
      local_318 = (long *)operator_new(0x20);
      *local_318 = (long)&PTR___State_00105cf8;
      local_318[1] = (long)&local_304;
      local_318[2] = (long)local_300;
      local_318[3] = (long)local_1c0;
      std::thread::_M_start_thread(&local_310,&local_318,0);
      if (local_318 != (long *)0x0) {
        (**(code **)(*local_318 + 8))();
      }
      pinThread(iVar1);
      iVar8 = 0;
      std::chrono::_V2::steady_clock::now();
      do {
        _Var7._M_i = local_280;
        _Var6._M_i = 0;
        if (local_300._64_8_ + 1 != local_300._0_8_) {
          _Var6._M_i = local_300._64_8_ + 1;
        }
        do {
          local_280 = _Var7._M_i;
          _Var7._M_i = local_240._M_i;
        } while (_Var6._M_i == local_280);
        *(int *)(local_300._8_8_ + (local_300._64_8_ + 0x10) * 4) = iVar8;
        do {
          while (local_100._M_i == local_c0._M_i) {
            local_c0._M_i = local_1c0._64_8_;
            if ((local_1c0._64_8_ != local_100._M_i) &&
               ((int *)(local_1c0._8_8_ + local_100._M_i * 4) != (int *)0xffffffffffffffc0))
            goto LAB_0010293d;
          }
        } while ((int *)(local_1c0._8_8_ + local_100._M_i * 4) == (int *)0xffffffffffffffc0);
LAB_0010293d:
        local_300._64_8_ = _Var6._M_i;
        rigtorp::SPSCQueue<int,_std::allocator<int>_>::pop
                  ((SPSCQueue<int,_std::allocator<int>_> *)local_1c0);
        iVar8 = iVar8 + 1;
      } while (iVar8 != 10000000);
      std::chrono::_V2::steady_clock::now();
      std::thread::join();
      poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ns RTT",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_310 == 0) {
        rigtorp::SPSCQueue<int,_std::allocator<int>_>::~SPSCQueue
                  ((SPSCQueue<int,_std::allocator<int>_> *)local_1c0);
        rigtorp::SPSCQueue<int,_std::allocator<int>_>::~SPSCQueue
                  ((SPSCQueue<int,_std::allocator<int>_> *)local_300);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"boost::lockfree::spsc:",0x16);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
        std::ostream::put(-0x18);
        std::ostream::flush();
        local_300._0_8_ = 0;
        local_300._64_8_ = 0;
        local_300._72_8_ = 0x989681;
        local_300._80_8_ = operator_new(0x2625a04);
        local_318 = (long *)0x0;
        local_1c0._0_8_ = operator_new(0x18);
        *(undefined ***)local_1c0._0_8_ = &PTR___State_00105d38;
        *(int **)(local_1c0._0_8_ + 8) = &local_304;
        *(SPSCQueue<int,_std::allocator<int>_> **)(local_1c0._0_8_ + 0x10) =
             (SPSCQueue<int,_std::allocator<int>_> *)local_300;
        std::thread::_M_start_thread(&local_318,local_1c0,0);
        if (local_1c0._0_8_ != 0) {
          (**(code **)(*(long *)local_1c0._0_8_ + 8))();
        }
        pinThread(iVar1);
        iVar8 = 0;
        std::chrono::_V2::steady_clock::now();
        do {
          do {
            _Var7._M_i = local_300._72_8_ + local_300._0_8_ + 1;
            do {
              _Var7._M_i = _Var7._M_i - local_300._72_8_;
            } while ((ulong)local_300._72_8_ <= _Var7._M_i);
          } while (local_300._64_8_ == _Var7._M_i);
          *(int *)(local_300._80_8_ + local_300._0_8_ * 4) = iVar8;
          iVar8 = iVar8 + 1;
          local_300._0_8_ = _Var7._M_i;
        } while (iVar8 != 10000000);
        std::thread::join();
        std::chrono::_V2::steady_clock::now();
        poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ops/ms",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if (local_318 == (long *)0x0) {
          boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::
          ~runtime_sized_ringbuffer
                    ((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)local_300);
          local_300._0_8_ = 0;
          local_300._64_8_ = 0;
          local_300._72_8_ = 0x989681;
          local_300._80_8_ = operator_new(0x2625a04);
          local_1c0._0_8_ = 0;
          local_1c0._64_8_ = 0;
          local_1c0._72_8_ = 0x989681;
          local_1c0._80_8_ = operator_new(0x2625a04);
          local_310 = 0;
          local_318 = (long *)operator_new(0x20);
          *local_318 = (long)&PTR___State_00105d78;
          local_318[1] = (long)&local_304;
          local_318[2] = (long)local_300;
          local_318[3] = (long)local_1c0;
          std::thread::_M_start_thread(&local_310,&local_318,0);
          if (local_318 != (long *)0x0) {
            (**(code **)(*local_318 + 8))();
          }
          pinThread(iVar1);
          iVar8 = 0;
          std::chrono::_V2::steady_clock::now();
          do {
            do {
              _Var7._M_i = local_300._72_8_ + local_300._0_8_ + 1;
              do {
                _Var7._M_i = _Var7._M_i - local_300._72_8_;
              } while ((ulong)local_300._72_8_ <= _Var7._M_i);
            } while (local_300._64_8_ == _Var7._M_i);
            *(int *)(local_300._80_8_ + local_300._0_8_ * 4) = iVar8;
            local_300._0_8_ = _Var7._M_i;
            do {
              sVar4 = boost::lockfree::detail::ringbuffer_base<int>::pop
                                ((ringbuffer_base<int> *)local_1c0,(int *)&local_318,1,
                                 (int *)local_1c0._80_8_,local_1c0._72_8_);
            } while (sVar4 != 1);
            iVar8 = iVar8 + 1;
          } while (iVar8 != 10000000);
          std::chrono::_V2::steady_clock::now();
          std::thread::join();
          poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ns RTT",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          if (local_310 == 0) {
            boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::
            ~runtime_sized_ringbuffer
                      ((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)local_1c0);
            boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::
            ~runtime_sized_ringbuffer
                      ((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)local_300);
            return 0;
          }
        }
      }
    }
    std::terminate();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_300,argv[1],(allocator<char> *)&local_318);
  uVar5 = local_300._0_8_;
  piVar2 = __errno_location();
  iVar8 = *piVar2;
  *piVar2 = 0;
  lVar9 = strtol((char *)uVar5,(char **)local_1c0,10);
  if (local_1c0._0_8_ == uVar5) {
    std::__throw_invalid_argument("stoi");
LAB_00102d7c:
    std::__throw_out_of_range("stoi");
  }
  else {
    iVar1 = (int)lVar9;
    if ((iVar1 != lVar9) || (*piVar2 == 0x22)) goto LAB_00102d7c;
    if (*piVar2 == 0) {
      *piVar2 = iVar8;
    }
    local_304 = iVar1;
    if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
      operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_300,argv[2],(allocator<char> *)&local_318);
    uVar5 = local_300._0_8_;
    iVar8 = *piVar2;
    *piVar2 = 0;
    lVar9 = strtol((char *)local_300._0_8_,(char **)local_1c0,10);
    if (local_1c0._0_8_ != uVar5) {
      if ((0xfffffffeffffffff < lVar9 - 0x80000000U) && (*piVar2 != 0x22)) {
        if (*piVar2 == 0) {
          *piVar2 = iVar8;
        }
        if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
          operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
        }
        goto LAB_001025fa;
      }
      goto LAB_00102d94;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00102d94:
  uVar5 = std::__throw_out_of_range("stoi");
  _Unwind_Resume(uVar5);
}

Assistant:

int main(int argc, char *argv[]) {
  (void)argc, (void)argv;

  using namespace rigtorp;

  int cpu1 = -1;
  int cpu2 = -1;

  if (argc == 3) {
    cpu1 = std::stoi(argv[1]);
    cpu2 = std::stoi(argv[2]);
  }

  const size_t queueSize = 10000000;
  const int64_t iters = 10000000;

  std::cout << "SPSCQueue:" << std::endl;

  {
    SPSCQueue<int> q(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        while (!q.front())
          ;
        if (*q.front() != i) {
          throw std::runtime_error("");
        }
        q.pop();
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      q.emplace(i);
    }
    t.join();
    auto stop = std::chrono::steady_clock::now();
    std::cout << iters * 1000000 /
                     std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                          start)
                         .count()
              << " ops/ms" << std::endl;
  }

  {
    SPSCQueue<int> q1(queueSize), q2(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        while (!q1.front())
          ;
        q2.emplace(*q1.front());
        q1.pop();
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      q1.emplace(i);
      while (!q2.front())
        ;
      q2.pop();
    }
    auto stop = std::chrono::steady_clock::now();
    t.join();
    std::cout << std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                      start)
                         .count() /
                     iters
              << " ns RTT" << std::endl;
  }

#if __has_include(<boost/lockfree/spsc_queue.hpp> )
  std::cout << "boost::lockfree::spsc:" << std::endl;
  {
    boost::lockfree::spsc_queue<int> q(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        int val;
        while (q.pop(&val, 1) != 1)
          ;
        if (val != i) {
          throw std::runtime_error("");
        }
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      while (!q.push(i))
        ;
    }
    t.join();
    auto stop = std::chrono::steady_clock::now();
    std::cout << iters * 1000000 /
                     std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                          start)
                         .count()
              << " ops/ms" << std::endl;
  }

  {
    boost::lockfree::spsc_queue<int> q1(queueSize), q2(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        int val;
        while (q1.pop(&val, 1) != 1)
          ;
        while (!q2.push(val))
          ;
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      while (!q1.push(i))
        ;
      int val;
      while (q2.pop(&val, 1) != 1)
        ;
    }
    auto stop = std::chrono::steady_clock::now();
    t.join();
    std::cout << std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                      start)
                         .count() /
                     iters
              << " ns RTT" << std::endl;
  }
#endif

#if __has_include(<folly/ProducerConsumerQueue.h>)
  std::cout << "folly::ProducerConsumerQueue:" << std::endl;

  {
    folly::ProducerConsumerQueue<int> q(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        int val;
        while (!q.read(val))
          ;
        if (val != i) {
          throw std::runtime_error("");
        }
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      while (!q.write(i))
        ;
    }
    t.join();
    auto stop = std::chrono::steady_clock::now();
    std::cout << iters * 1000000 /
                     std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                          start)
                         .count()
              << " ops/ms" << std::endl;
  }

  {
    folly::ProducerConsumerQueue<int> q1(queueSize), q2(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        int val;
        while (!q1.read(val))
          ;
        q2.write(val);
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      while (!q1.write(i))
        ;
      int val;
      while (!q2.read(val))
        ;
    }
    auto stop = std::chrono::steady_clock::now();
    t.join();
    std::cout << std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                      start)
                         .count() /
                     iters
              << " ns RTT" << std::endl;
  }
#endif

  return 0;
}